

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O3

void __thiscall efsw::DirWatcherGeneric::watch(DirWatcherGeneric *this,bool reportOwnChange)

{
  WatchID WVar1;
  FileWatchListener *pFVar2;
  pointer pcVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  undefined7 in_register_00000031;
  pointer pFVar6;
  pointer ppVar7;
  char *__end;
  DirectorySnapshotDiff Diff;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  DirectorySnapshotDiff local_298;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  DirectorySnapshot::scan(&local_298,&this->DirSnap);
  if ((((int)CONCAT71(in_register_00000031,reportOwnChange) != 0) && (local_298.DirChanged == true))
     && (this->Parent != (DirWatcherGeneric *)0x0)) {
    WVar1 = (this->Watch->super_Watcher).ID;
    pFVar2 = (this->Watch->super_Watcher).Listener;
    pcVar3 = (this->DirSnap).DirectoryInfo.Filepath._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,
               pcVar3 + (this->DirSnap).DirectoryInfo.Filepath._M_string_length);
    FileSystem::pathRemoveFileName(&local_50,&local_90);
    pcVar3 = (this->DirSnap).DirectoryInfo.Filepath._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar3,
               pcVar3 + (this->DirSnap).DirectoryInfo.Filepath._M_string_length);
    FileSystem::fileNameFromPath(&local_70,&local_b0);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
    (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,&local_50,&local_70,3,local_d0);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  bVar4 = DirectorySnapshotDiff::changed(&local_298);
  if (bVar4) {
    if (local_298.FilesCreated.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_298.FilesCreated.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pFVar6 = local_298.FilesCreated.
               super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"","");
        handleAction(this,&pFVar6->Filepath,1,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        pFVar6 = pFVar6 + 1;
      } while (pFVar6 != local_298.FilesCreated.
                         super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl
                         .super__Vector_impl_data._M_finish);
    }
    if (local_298.FilesModified.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_298.FilesModified.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pFVar6 = local_298.FilesModified.
               super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"","");
        handleAction(this,&pFVar6->Filepath,3,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        pFVar6 = pFVar6 + 1;
      } while (pFVar6 != local_298.FilesModified.
                         super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl
                         .super__Vector_impl_data._M_finish);
    }
    if (local_298.FilesDeleted.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_298.FilesDeleted.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pFVar6 = local_298.FilesDeleted.
               super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"","");
        handleAction(this,&pFVar6->Filepath,2,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        pFVar6 = pFVar6 + 1;
      } while (pFVar6 != local_298.FilesDeleted.
                         super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl
                         .super__Vector_impl_data._M_finish);
    }
    if (local_298.FilesMoved.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_298.FilesMoved.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar7 = local_298.FilesMoved.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar3 = (ppVar7->first)._M_dataplus._M_p;
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,pcVar3,pcVar3 + (ppVar7->first)._M_string_length);
        handleAction(this,&(ppVar7->second).Filepath,4,&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        ppVar7 = ppVar7 + 1;
      } while (ppVar7 != local_298.FilesMoved.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_298.DirsCreated.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_298.DirsCreated.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pFVar6 = local_298.DirsCreated.
               super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pcVar3 = (pFVar6->Filepath)._M_dataplus._M_p;
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,pcVar3,pcVar3 + (pFVar6->Filepath)._M_string_length);
        createDirectory(this,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        pFVar6 = pFVar6 + 1;
      } while (pFVar6 != local_298.DirsCreated.
                         super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl
                         .super__Vector_impl_data._M_finish);
    }
    if (local_298.DirsModified.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_298.DirsModified.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pFVar6 = local_298.DirsModified.
               super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"","");
        handleAction(this,&pFVar6->Filepath,3,&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        pFVar6 = pFVar6 + 1;
      } while (pFVar6 != local_298.DirsModified.
                         super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl
                         .super__Vector_impl_data._M_finish);
    }
    if (local_298.DirsDeleted.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_298.DirsDeleted.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pFVar6 = local_298.DirsDeleted.
               super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"","");
        handleAction(this,&pFVar6->Filepath,2,&local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
        pcVar3 = (pFVar6->Filepath)._M_dataplus._M_p;
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b0,pcVar3,pcVar3 + (pFVar6->Filepath)._M_string_length);
        removeDirectory(this,&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        pFVar6 = pFVar6 + 1;
      } while (pFVar6 != local_298.DirsDeleted.
                         super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl
                         .super__Vector_impl_data._M_finish);
    }
    if (local_298.DirsMoved.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_298.DirsMoved.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar7 = local_298.DirsMoved.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        pcVar3 = (ppVar7->first)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d8,pcVar3,pcVar3 + (ppVar7->first)._M_string_length);
        handleAction(this,&(ppVar7->second).Filepath,4,&local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
        pcVar3 = (ppVar7->first)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f8,pcVar3,pcVar3 + (ppVar7->first)._M_string_length);
        pcVar3 = (ppVar7->second).Filepath._M_dataplus._M_p;
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,pcVar3,pcVar3 + (ppVar7->second).Filepath._M_string_length);
        moveDirectory(this,&local_2f8,&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p);
        }
        ppVar7 = ppVar7 + 1;
      } while (ppVar7 != local_298.DirsMoved.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  for (p_Var5 = (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->Directories)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    watch(*(DirWatcherGeneric **)(p_Var5 + 2),false);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  ::~vector(&local_298.DirsMoved);
  std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_298.DirsModified);
  std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_298.DirsCreated);
  std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_298.DirsDeleted);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  ::~vector(&local_298.FilesMoved);
  std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_298.FilesModified);
  std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_298.FilesCreated);
  std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_298.FilesDeleted);
  return;
}

Assistant:

void DirWatcherGeneric::watch( bool reportOwnChange ) {
	DirectorySnapshotDiff Diff = DirSnap.scan();

	if ( reportOwnChange && Diff.DirChanged && NULL != Parent ) {
		Watch->Listener->handleFileAction(
			Watch->ID, FileSystem::pathRemoveFileName( DirSnap.DirectoryInfo.Filepath ),
			FileSystem::fileNameFromPath( DirSnap.DirectoryInfo.Filepath ), Actions::Modified );
	}

	if ( Diff.changed() ) {
		FileInfoList::iterator it;
		MovedList::iterator mit;

		/// Files
		DiffIterator( FilesCreated ) {
			handleAction( ( *it ).Filepath, Actions::Add );
		}

		DiffIterator( FilesModified ) {
			handleAction( ( *it ).Filepath, Actions::Modified );
		}

		DiffIterator( FilesDeleted ) {
			handleAction( ( *it ).Filepath, Actions::Delete );
		}

		DiffMovedIterator( FilesMoved ) {
			handleAction( ( *mit ).second.Filepath, Actions::Moved, ( *mit ).first );
		}

		/// Directories
		DiffIterator( DirsCreated ) {
			createDirectory( ( *it ).Filepath );
		}

		DiffIterator( DirsModified ) {
			handleAction( ( *it ).Filepath, Actions::Modified );
		}

		DiffIterator( DirsDeleted ) {
			handleAction( ( *it ).Filepath, Actions::Delete );
			removeDirectory( ( *it ).Filepath );
		}

		DiffMovedIterator( DirsMoved ) {
			handleAction( ( *mit ).second.Filepath, Actions::Moved, ( *mit ).first );
			moveDirectory( ( *mit ).first, ( *mit ).second.Filepath );
		}
	}

	/// Process the subdirectories looking for changes
	for ( DirWatchMap::iterator dit = Directories.begin(); dit != Directories.end(); ++dit ) {
		/// Just watch
		dit->second->watch();
	}
}